

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void cmInstallGenerator::AddTweak
               (ostream *os,Indent indent,string *config,string *dir,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,TweakMethod *tweak)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  string tws;
  ostringstream tw;
  string local_268;
  cmAlphaNum local_248;
  cmAlphaNum local_218;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  pbVar3 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 == 0x20) {
    local_1a8._8_8_ = (dir->_M_dataplus)._M_p;
    local_1a8._0_8_ = dir->_M_string_length;
    local_218.View_._M_str = (pbVar3->_M_dataplus)._M_p;
    local_218.View_._M_len = pbVar3->_M_string_length;
    cmStrCat<>(&local_268,(cmAlphaNum *)local_1a8,&local_218);
    GetDestDirPath((string *)&local_248,&local_268);
    AddTweak(os,indent,config,(string *)&local_248,tweak);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"${file}",(allocator<char> *)&local_248);
    AddTweak((ostream *)local_1a8,(Indent)(indent.Level + 2),config,(string *)&local_218,tweak);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::stringbuf::str();
    if (local_268._M_string_length != 0) {
      poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar2,"foreach(file\n");
      pbVar1 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar3 = (files->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1;
          pbVar3 = pbVar3 + 1) {
        poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)(indent.Level + 4));
        poVar2 = std::operator<<(poVar2,"\"");
        local_218.View_._M_str = (dir->_M_dataplus)._M_p;
        local_218.View_._M_len = dir->_M_string_length;
        local_248.View_._M_str = (pbVar3->_M_dataplus)._M_p;
        local_248.View_._M_len = pbVar3->_M_string_length;
        cmStrCat<>(&local_1e8,&local_218,&local_248);
        GetDestDirPath(&local_1c8,&local_1e8);
        poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
        std::operator<<(poVar2,"\"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)(indent.Level + 4));
      std::operator<<(poVar2,")\n");
      std::operator<<(os,(string *)&local_268);
      poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar2,"endforeach()\n");
    }
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  return;
}

Assistant:

void cmInstallGenerator::AddTweak(std::ostream& os, Indent indent,
                                  const std::string& config,
                                  std::string const& dir,
                                  std::vector<std::string> const& files,
                                  const TweakMethod& tweak)
{
  if (files.size() == 1) {
    // Tweak a single file.
    AddTweak(os, indent, config, GetDestDirPath(cmStrCat(dir, files[0])),
             tweak);
  } else {
    // Generate a foreach loop to tweak multiple files.
    std::ostringstream tw;
    AddTweak(tw, indent.Next(), config, "${file}", tweak);
    std::string tws = tw.str();
    if (!tws.empty()) {
      Indent indent2 = indent.Next().Next();
      os << indent << "foreach(file\n";
      for (std::string const& f : files) {
        os << indent2 << "\"" << GetDestDirPath(cmStrCat(dir, f)) << "\"\n";
      }
      os << indent2 << ")\n";
      os << tws;
      os << indent << "endforeach()\n";
    }
  }
}